

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int setbf(match *res,bitfield *bf,ull num)

{
  expr *peVar1;
  ull in_RDX;
  long in_RSI;
  expr e_1;
  expr *e;
  undefined4 local_70;
  etype in_stack_ffffffffffffff94;
  expr *in_stack_ffffffffffffffa8;
  bitfield *in_stack_ffffffffffffffb0;
  match *in_stack_ffffffffffffffb8;
  int local_4;
  
  if (*(int *)(in_RSI + 0x18) == 0) {
    memset(&local_70,0,0x48);
    local_70 = 0;
    local_4 = setbfe(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    peVar1 = makeex(in_stack_ffffffffffffff94);
    peVar1->num1 = in_RDX;
    peVar1->isimm = 1;
    local_4 = setbfe(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return local_4;
}

Assistant:

int setbf (struct match *res, const struct bitfield *bf, ull num) {
	if (bf->pcrel) {
		struct expr *e = makeex(EXPR_NUM);
		e->num1 = num;
		e->isimm = 1;
		return setbfe(res, bf, e);
	} else {
		struct expr e = { .type = EXPR_NUM, .num1 = num, .isimm = 1 };
		return setbfe(res, bf, &e);
	}
}